

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void compact_int16_suite::fail_array64_int16_invalid_length(void)

{
  value_type input [13];
  decoder decoder;
  undefined4 local_48;
  value local_44;
  uchar local_40 [16];
  decoder local_30;
  
  local_30.input._M_str = local_40;
  local_40[8] = '\0';
  local_40[9] = '\x12';
  local_40[10] = '4';
  local_40[0xb] = 'V';
  local_40[0xc] = 'x';
  local_40[0] = 0xda;
  local_40[1] = '\x03';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  local_30.input._M_len = 0xd;
  local_30.current.view._M_len = 0;
  local_30.current.view._M_str = (uchar *)0x0;
  local_30.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_30);
  local_44 = local_30.current.code;
  local_48 = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::error_invalid_length",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x828,"void compact_int16_suite::fail_array64_int16_invalid_length()",&local_44,
             &local_48);
  return;
}

Assistant:

void fail_array64_int16_invalid_length()
{
    const value_type input[] = { token::code::array64_int16, 0x03, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x12, 0x34, 0x56, 0x78 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_invalid_length);
}